

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O0

void __thiscall QMessageBox::setDetailedText(QMessageBox *this,QString *text)

{
  bool bVar1;
  QMessageBoxPrivate *parent;
  DetailButton *in_RSI;
  QAbstractButton *in_RDI;
  QAbstractButton *unaff_retaddr;
  QMessageBox *in_stack_00000008;
  bool autoAddOkButton;
  QMessageBoxPrivate *d;
  QWidget *in_stack_00000058;
  QMessageBoxDetailsText *in_stack_00000060;
  QMessageBoxPrivate *in_stack_000000d0;
  DetailButton *in_stack_ffffffffffffffc8;
  QMessageBoxDetailsText *in_stack_ffffffffffffffd0;
  QAbstractButton *pQVar2;
  ButtonRole role;
  
  pQVar2 = in_RDI;
  parent = d_func((QMessageBox *)0x7a8661);
  role = (ButtonRole)((ulong)pQVar2 >> 0x20);
  bVar1 = QString::isEmpty((QString *)0x7a8670);
  if (bVar1) {
    if (parent->detailsText != (QMessageBoxDetailsText *)0x0) {
      QWidget::hide((QWidget *)0x7a8699);
      QObject::deleteLater();
    }
    parent->detailsText = (QMessageBoxDetailsText *)0x0;
    removeButton((QMessageBox *)in_stack_ffffffffffffffd0,in_RDI);
    if (parent->detailsButton != (DetailButton *)0x0) {
      QWidget::hide((QWidget *)0x7a86f0);
      QObject::deleteLater();
    }
    parent->detailsButton = (DetailButton *)0x0;
  }
  else {
    if (parent->detailsText == (QMessageBoxDetailsText *)0x0) {
      in_stack_ffffffffffffffd0 = (QMessageBoxDetailsText *)operator_new(0x38);
      QMessageBoxDetailsText::QMessageBoxDetailsText(in_stack_00000060,in_stack_00000058);
      parent->detailsText = in_stack_ffffffffffffffd0;
      QWidget::hide((QWidget *)0x7a8763);
    }
    if (parent->detailsButton == (DetailButton *)0x0) {
      bVar1 = parent->autoAddOkButton;
      in_stack_ffffffffffffffc8 = (DetailButton *)operator_new(0x28);
      DetailButton::DetailButton(in_RSI,(QWidget *)parent);
      parent->detailsButton = in_stack_ffffffffffffffc8;
      addButton(in_stack_00000008,unaff_retaddr,role);
      parent->autoAddOkButton = (bool)(bVar1 & 1);
    }
    QMessageBoxDetailsText::setText(in_stack_ffffffffffffffd0,(QString *)in_stack_ffffffffffffffc8);
  }
  QMessageBoxPrivate::setupLayout(in_stack_000000d0);
  return;
}

Assistant:

void QMessageBox::setDetailedText(const QString &text)
{
    Q_D(QMessageBox);
    if (text.isEmpty()) {
        if (d->detailsText) {
            d->detailsText->hide();
            d->detailsText->deleteLater();
        }
        d->detailsText = nullptr;
        removeButton(d->detailsButton);
        if (d->detailsButton) {
            d->detailsButton->hide();
            d->detailsButton->deleteLater();
        }
        d->detailsButton = nullptr;
    } else {
        if (!d->detailsText) {
            d->detailsText = new QMessageBoxDetailsText(this);
            d->detailsText->hide();
        }
        if (!d->detailsButton) {
            const bool autoAddOkButton = d->autoAddOkButton; // QTBUG-39334, addButton() clears the flag.
            d->detailsButton = new DetailButton(this);
            addButton(d->detailsButton, QMessageBox::ActionRole);
            d->autoAddOkButton = autoAddOkButton;
        }
        d->detailsText->setText(text);
    }
    d->setupLayout();
}